

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O3

void __thiscall
server::collectservmode::leavegame(collectservmode *this,clientinfo *ci,bool disconnecting)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  token *ptVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined7 in_register_00000011;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  packetbuf local_58;
  
  (ci->state).tokens = 0;
  if ((int)CONCAT71(in_register_00000011,disconnecting) != 0) {
    iVar13 = strcmp(ci->team,"good");
    if (iVar13 == 0) {
      iVar13 = 1;
    }
    else {
      iVar13 = strcmp(ci->team,"evil");
      iVar13 = (uint)(iVar13 == 0) * 2;
    }
    uVar19 = (this->tokens).ulen;
    if (0 < (int)uVar19) {
      ptVar5 = (this->tokens).buf;
      iVar4 = ci->clientnum;
      lVar14 = (ulong)(uVar19 - 1) << 5;
      iVar16 = 0;
      iVar17 = 0;
      do {
        if (*(int *)((long)&ptVar5->dropper + lVar14) == iVar4) {
          *(undefined4 *)((long)&ptVar5->dropper + lVar14) = 0x80000000;
          if (*(int *)((long)&ptVar5->team + lVar14) == iVar13) {
            iVar10 = iVar17;
            iVar11 = iVar16 + 1;
            iVar12 = iVar16;
          }
          else {
            iVar10 = iVar17 + 1;
            iVar11 = iVar16;
            iVar12 = iVar17;
          }
          iVar16 = iVar11;
          iVar17 = iVar10;
          if (0xe < iVar12) {
            local_58.super_ucharbuf.flags = '\0';
            local_58.super_ucharbuf.len = 0;
            local_58.super_ucharbuf.maxlen = 0;
            local_58.growth = 300;
            local_58.packet = enet_packet_create((void *)0x0,300,1);
            local_58.super_ucharbuf.buf = (local_58.packet)->data;
            local_58.super_ucharbuf.maxlen = (int)(local_58.packet)->dataLength;
            putint(&local_58,0x6d);
            putint(&local_58,*(int *)((long)&ptVar5->id + lVar14));
            ptVar5 = (this->tokens).buf;
            iVar4 = (this->tokens).ulen;
            uVar1 = iVar4 - 1;
            (this->tokens).ulen = uVar1;
            if (1 < iVar4) {
              uVar7 = *(undefined8 *)(ptVar5 + uVar1);
              uVar8 = *(undefined8 *)&ptVar5[uVar1].droptime;
              puVar2 = (undefined8 *)((long)&ptVar5[uVar1].o.field_0 + 4);
              uVar9 = puVar2[1];
              puVar3 = (undefined8 *)((long)&(ptVar5->o).field_0 + lVar14 + 4);
              *puVar3 = *puVar2;
              puVar3[1] = uVar9;
              puVar2 = (undefined8 *)((long)&ptVar5->id + lVar14);
              *puVar2 = uVar7;
              puVar2[1] = uVar8;
            }
            if (1 < uVar19) {
              lVar15 = (ulong)(uVar19 - 2) << 5;
              lVar14 = (ulong)(uVar19 - 2) + 1;
              do {
                ptVar5 = (this->tokens).buf;
                if (*(int *)((long)&ptVar5->dropper + lVar15) == ci->clientnum) {
                  *(undefined4 *)((long)&ptVar5->dropper + lVar15) = 0x80000000;
                  if (*(int *)((long)&ptVar5->team + lVar15) == iVar13) {
                    iVar12 = iVar16 + 1;
                    iVar10 = iVar17;
                    iVar4 = iVar16;
                  }
                  else {
                    iVar12 = iVar16;
                    iVar10 = iVar17 + 1;
                    iVar4 = iVar17;
                  }
                  iVar17 = iVar10;
                  iVar16 = iVar12;
                  if (0xe < iVar4) {
                    putint(&local_58,*(int *)((long)&ptVar5->id + lVar15));
                    ptVar5 = (this->tokens).buf;
                    iVar4 = (this->tokens).ulen;
                    uVar19 = iVar4 - 1;
                    (this->tokens).ulen = uVar19;
                    if (1 < iVar4) {
                      uVar7 = *(undefined8 *)(ptVar5 + uVar19);
                      uVar8 = *(undefined8 *)&ptVar5[uVar19].droptime;
                      puVar2 = (undefined8 *)((long)&ptVar5[uVar19].o.field_0 + 4);
                      uVar9 = puVar2[1];
                      puVar3 = (undefined8 *)((long)&(ptVar5->o).field_0 + lVar15 + 4);
                      *puVar3 = *puVar2;
                      puVar3[1] = uVar9;
                      puVar2 = (undefined8 *)((long)&ptVar5->id + lVar15);
                      *puVar2 = uVar7;
                      puVar2[1] = uVar8;
                    }
                  }
                }
                lVar15 = lVar15 + -0x20;
                lVar18 = lVar14 + -1;
                bVar6 = 0 < lVar14;
                lVar14 = lVar18;
              } while (lVar18 != 0 && bVar6);
            }
            putint(&local_58,-1);
            enet_packet_resize(local_58.packet,(long)local_58.super_ucharbuf.len);
            local_58.super_ucharbuf.buf = (local_58.packet)->data;
            local_58.super_ucharbuf.maxlen = (int)(local_58.packet)->dataLength;
            sendpacket(-1,1,local_58.packet,-1);
            if (local_58.growth < 1) {
              return;
            }
            if (local_58.packet == (ENetPacket *)0x0) {
              return;
            }
            if ((local_58.packet)->referenceCount != 0) {
              return;
            }
            enet_packet_destroy(local_58.packet);
            return;
          }
        }
        lVar14 = lVar14 + -0x20;
        bVar6 = 1 < (int)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

void leavegame(clientinfo *ci, bool disconnecting = false)
    {
        ci->state.tokens = 0;
        if(disconnecting)
        {
            int team = collectteambase(ci->team), totalfriendly = 0, totalenemy = 0;
            loopvrev(tokens)
            {
                token &t = tokens[i];
                if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                {
                    packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
                    putint(p, N_EXPIRETOKENS);
                    putint(p, t.id);
                    tokens.removeunordered(i);
                    while(--i >= 0)
                    {
                        token &t = tokens[i];
                        if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                        if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                        {
                            putint(p, t.id);
                            tokens.removeunordered(i);
                        }
                    }
                    putint(p, -1);
                    sendpacket(-1, 1, p.finalize());
                }
            }
        }
    }